

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O1

bool __thiscall
cmFileCommand::HandleDownloadCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pcVar1;
  cmMakefile *pcVar2;
  auto_ptr<cmCryptoHash> aVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  CURLcode CVar7;
  undefined8 uVar8;
  long lVar9;
  cmCryptoHash *this_00;
  long lVar10;
  CURL_conflict *data;
  ostream *poVar11;
  curl_slist *list;
  char *pcVar12;
  long *plVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  size_type *psVar15;
  pointer pbVar16;
  value_type *s;
  cmCryptoHash *x_1;
  auto_ptr<cmCryptoHash> hash;
  cURLProgressHelper helper;
  string err_2;
  string actualHash_1;
  cURLEasyGuard g_curl;
  string expectedHash;
  string file;
  string dir;
  string statusVar;
  cmFileCommandVectorOfChar chunkDebug;
  string status;
  string hashMatchMSG;
  ofstream fout;
  string logVar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  curl_headers;
  string userpwd;
  string url;
  bool local_5d1;
  auto_ptr<cmCryptoHash> local_5d0;
  long local_5c8;
  undefined1 local_5c0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5a0;
  undefined1 local_590 [8];
  char *local_588;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_580 [6];
  ios_base local_520 [264];
  ulong local_418;
  string local_410;
  cURLEasyGuard local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  string local_3c8;
  string local_3a8;
  string local_388;
  vector<char,_std::allocator<char>_> local_368;
  char *local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  undefined1 *local_328;
  char *local_320;
  undefined1 local_318;
  undefined7 uStack_317;
  undefined1 local_308 [8];
  size_type local_300;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f8;
  byte abStack_2e8 [80];
  ios_base local_298 [136];
  ios_base local_210 [264];
  string local_108;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e8;
  undefined1 *local_d0;
  long local_c8;
  undefined1 local_c0;
  undefined7 uStack_bf;
  long *local_b0 [2];
  long local_a0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pbVar16 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar16) < 0x41) {
    local_308 = (undefined1  [8])&local_2f8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_308,"DOWNLOAD must be called with at least three arguments.","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_308);
    if (local_308 != (undefined1  [8])&local_2f8) {
      operator_delete((void *)local_308,local_2f8._M_allocated_capacity + 1);
    }
    return false;
  }
  local_b0[0] = local_a0;
  pcVar1 = pbVar16[1]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_b0,pcVar1,pcVar1 + pbVar16[1]._M_string_length);
  local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
  pcVar1 = pbVar16[2]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3c8,pcVar1,pcVar1 + pbVar16[2]._M_string_length);
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  local_108._M_string_length = 0;
  local_108.field_2._M_local_buf[0] = '\0';
  local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
  local_388._M_string_length = 0;
  local_388.field_2._M_local_buf[0] = '\0';
  pcVar2 = (this->super_cmCommand).Makefile;
  local_308 = (undefined1  [8])&local_2f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"CMAKE_TLS_VERIFY","");
  local_5d1 = cmMakefile::IsOn(pcVar2,(string *)local_308);
  if (local_308 != (undefined1  [8])&local_2f8) {
    operator_delete((void *)local_308,local_2f8._M_allocated_capacity + 1);
  }
  pcVar2 = (this->super_cmCommand).Makefile;
  local_308 = (undefined1  [8])&local_2f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"CMAKE_TLS_CAINFO","");
  local_350 = cmMakefile::GetDefinition(pcVar2,(string *)local_308);
  s = pbVar16 + 3;
  if (local_308 != (undefined1  [8])&local_2f8) {
    operator_delete((void *)local_308,local_2f8._M_allocated_capacity + 1);
  }
  local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
  local_3e8._M_string_length = 0;
  local_3e8.field_2._M_local_buf[0] = '\0';
  local_328 = &local_318;
  local_320 = (char *)0x0;
  local_318 = 0;
  local_5d0.x_ = (cmCryptoHash *)0x0;
  local_d0 = &local_c0;
  local_c8 = 0;
  local_c0 = 0;
  local_e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (s == (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish) {
    local_5c8 = 0;
    local_418 = 0;
    lVar9 = 0;
  }
  else {
    lVar9 = 0;
    local_5c8 = 0;
    local_418 = 0;
    do {
      iVar6 = std::__cxx11::string::compare((char *)s);
      if (iVar6 == 0) {
        s = s + 1;
        if (s == (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish) {
          local_308 = (undefined1  [8])&local_2f8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_308,"DOWNLOAD missing time for TIMEOUT.","");
          cmCommand::SetError(&this->super_cmCommand,(string *)local_308);
          goto LAB_002f4b86;
        }
        lVar9 = atol((s->_M_dataplus)._M_p);
      }
      else {
        iVar6 = std::__cxx11::string::compare((char *)s);
        if (iVar6 == 0) {
          s = s + 1;
          if (s == (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish) {
            local_308 = (undefined1  [8])&local_2f8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_308,"DOWNLOAD missing time for INACTIVITY_TIMEOUT.","");
            cmCommand::SetError(&this->super_cmCommand,(string *)local_308);
            goto LAB_002f4b86;
          }
          local_5c8 = atol((s->_M_dataplus)._M_p);
        }
        else {
          iVar6 = std::__cxx11::string::compare((char *)s);
          if (iVar6 == 0) {
            s = s + 1;
            if (s == (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish) {
              local_308 = (undefined1  [8])&local_2f8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_308,"DOWNLOAD missing VAR for LOG.","");
              cmCommand::SetError(&this->super_cmCommand,(string *)local_308);
              goto LAB_002f4b86;
            }
            std::__cxx11::string::_M_assign((string *)&local_108);
          }
          else {
            iVar6 = std::__cxx11::string::compare((char *)s);
            if (iVar6 == 0) {
              s = s + 1;
              if (s == (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish) {
                local_308 = (undefined1  [8])&local_2f8;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_308,"DOWNLOAD missing VAR for STATUS.","");
                cmCommand::SetError(&this->super_cmCommand,(string *)local_308);
                goto LAB_002f4b86;
              }
              std::__cxx11::string::_M_assign((string *)&local_388);
            }
            else {
              iVar6 = std::__cxx11::string::compare((char *)s);
              if (iVar6 == 0) {
                s = s + 1;
                if (s == (args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish) {
                  local_308 = (undefined1  [8])&local_2f8;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_308,"TLS_VERIFY missing bool value.","");
                  cmCommand::SetError(&this->super_cmCommand,(string *)local_308);
                  goto LAB_002f4b86;
                }
                local_5d1 = cmSystemTools::IsOn((s->_M_dataplus)._M_p);
              }
              else {
                iVar6 = std::__cxx11::string::compare((char *)s);
                if (iVar6 == 0) {
                  s = s + 1;
                  if (s == (args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish) {
                    local_308 = (undefined1  [8])&local_2f8;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_308,"TLS_CAFILE missing file value.","");
                    cmCommand::SetError(&this->super_cmCommand,(string *)local_308);
                    goto LAB_002f4b86;
                  }
                  local_350 = (s->_M_dataplus)._M_p;
                }
                else {
                  iVar6 = std::__cxx11::string::compare((char *)s);
                  if (iVar6 == 0) {
                    s = s + 1;
                    if (s == (args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish) {
                      local_308 = (undefined1  [8])&local_2f8;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_308,"DOWNLOAD missing sum value for EXPECTED_MD5.",
                                 "");
                      cmCommand::SetError(&this->super_cmCommand,(string *)local_308);
                      goto LAB_002f4b86;
                    }
                    this_00 = (cmCryptoHash *)operator_new(0x10);
                    cmCryptoHash::cmCryptoHash(this_00,AlgoMD5);
                    local_308 = (undefined1  [8])0x0;
                    ::cm::auto_ptr<cmCryptoHash>::reset(&local_5d0,this_00);
                    ::cm::auto_ptr<cmCryptoHash>::~auto_ptr((auto_ptr<cmCryptoHash> *)local_308);
                    std::__cxx11::string::_M_replace((ulong)&local_328,0,local_320,0x571fad);
                    cmsys::SystemTools::LowerCase((string *)local_308,s);
                    std::__cxx11::string::operator=((string *)&local_3e8,(string *)local_308);
LAB_002f3fc8:
                    if (local_308 != (undefined1  [8])&local_2f8) {
                      operator_delete((void *)local_308,local_2f8._M_allocated_capacity + 1);
                    }
                  }
                  else {
                    uVar8 = std::__cxx11::string::compare((char *)s);
                    if ((int)uVar8 == 0) {
                      local_418 = CONCAT71((int7)((ulong)uVar8 >> 8),1);
                    }
                    else {
                      iVar6 = std::__cxx11::string::compare((char *)s);
                      if (iVar6 == 0) {
                        pbVar16 = s + 1;
                        if (pbVar16 ==
                            (args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish) {
                          local_308 = (undefined1  [8])&local_2f8;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_308,
                                     "DOWNLOAD missing ALGO=value for EXPECTED_HASH.","");
                          cmCommand::SetError(&this->super_cmCommand,(string *)local_308);
LAB_002f4b86:
                          if (local_308 != (undefined1  [8])&local_2f8) {
                            operator_delete((void *)local_308,local_2f8._M_allocated_capacity + 1);
                          }
                        }
                        else {
                          lVar10 = std::__cxx11::string::find((char *)pbVar16,0x58c320,0);
                          if (lVar10 == -1) {
                            local_308 = (undefined1  [8])&local_2f8;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)local_308,
                                       "DOWNLOAD EXPECTED_HASH expects ALGO=value but got: ","");
                            std::__cxx11::string::_M_append(local_308,(ulong)s[1]._M_dataplus._M_p);
                            cmCommand::SetError(&this->super_cmCommand,(string *)local_308);
                            goto LAB_002f4b86;
                          }
                          std::__cxx11::string::substr((ulong)local_308,(ulong)pbVar16);
                          std::__cxx11::string::substr((ulong)local_5c0,(ulong)pbVar16);
                          cmsys::SystemTools::LowerCase((string *)local_590,(string *)local_5c0);
                          std::__cxx11::string::operator=((string *)&local_3e8,(string *)local_590);
                          if (local_590 != (undefined1  [8])local_580) {
                            operator_delete((void *)local_590,
                                            CONCAT71(local_580[0]._M_allocated_capacity._1_7_,
                                                     local_580[0]._M_local_buf[0]) + 1);
                          }
                          if ((cmCryptoHash *)local_5c0._0_8_ != (cmCryptoHash *)(local_5c0 + 0x10))
                          {
                            operator_delete((void *)local_5c0._0_8_,local_5c0._16_8_ + 1);
                          }
                          cmCryptoHash::New((cmCryptoHash *)local_5c0,(char *)local_308);
                          uVar8 = local_5c0._0_8_;
                          local_5c0._0_8_ = (cmCryptoHash *)0x0;
                          local_590 = (undefined1  [8])0x0;
                          ::cm::auto_ptr<cmCryptoHash>::reset(&local_5d0,(cmCryptoHash *)uVar8);
                          ::cm::auto_ptr<cmCryptoHash>::~auto_ptr
                                    ((auto_ptr<cmCryptoHash> *)local_590);
                          ::cm::auto_ptr<cmCryptoHash>::~auto_ptr
                                    ((auto_ptr<cmCryptoHash> *)local_5c0);
                          aVar3.x_ = local_5d0.x_;
                          if (local_5d0.x_ == (cmCryptoHash *)0x0) {
                            local_590 = (undefined1  [8])local_580;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)local_590,
                                       "DOWNLOAD EXPECTED_HASH given unknown ALGO: ","");
                            std::__cxx11::string::_M_append((char *)local_590,(ulong)local_308);
                            cmCommand::SetError(&this->super_cmCommand,
                                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)local_590);
                          }
                          else {
                            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)local_590,
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)local_308," hash");
                            std::__cxx11::string::operator=
                                      ((string *)&local_328,(string *)local_590);
                          }
                          if (local_590 != (undefined1  [8])local_580) {
                            operator_delete((void *)local_590,
                                            CONCAT71(local_580[0]._M_allocated_capacity._1_7_,
                                                     local_580[0]._M_local_buf[0]) + 1);
                          }
                          if (local_308 != (undefined1  [8])&local_2f8) {
                            operator_delete((void *)local_308,local_2f8._M_allocated_capacity + 1);
                          }
                          s = pbVar16;
                          if (aVar3.x_ != (cmCryptoHash *)0x0) goto LAB_002f3e9e;
                        }
                        bVar4 = false;
                        goto LAB_002f4bad;
                      }
                      iVar6 = std::__cxx11::string::compare((char *)s);
                      if (iVar6 == 0) {
                        if (s + 1 == (args->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish) {
                          local_308 = (undefined1  [8])&local_2f8;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_308,"DOWNLOAD missing string for USERPWD.","");
                          cmCommand::SetError(&this->super_cmCommand,(string *)local_308);
                          goto LAB_002f4b86;
                        }
                        std::__cxx11::string::_M_assign((string *)&local_d0);
                        s = s + 1;
                      }
                      else {
                        iVar6 = std::__cxx11::string::compare((char *)s);
                        if (iVar6 != 0) {
                          local_308 = (undefined1  [8])&local_2f8;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_308,"Unexpected argument: ","");
                          std::__cxx11::string::_M_append
                                    ((char *)local_308,(ulong)(s->_M_dataplus)._M_p);
                          cmMakefile::IssueMessage
                                    ((this->super_cmCommand).Makefile,AUTHOR_WARNING,
                                     (string *)local_308);
                          goto LAB_002f3fc8;
                        }
                        s = s + 1;
                        if (s == (args->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish) {
                          local_308 = (undefined1  [8])&local_2f8;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_308,"DOWNLOAD missing string for HTTPHEADER.",
                                     "");
                          cmCommand::SetError(&this->super_cmCommand,(string *)local_308);
                          goto LAB_002f4b86;
                        }
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::push_back(&local_e8,s);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
LAB_002f3e9e:
      s = s + 1;
    } while (s != (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish);
  }
  bVar4 = cmsys::SystemTools::FileExists(local_3c8._M_dataplus._M_p);
  if ((bVar4) && (local_5d0.x_ != (cmCryptoHash *)0x0)) {
    local_588 = (char *)0x0;
    local_580[0]._M_local_buf[0] = '\0';
    local_590 = (undefined1  [8])local_580;
    cmCryptoHash::HashFile((string *)local_5c0,local_5d0.x_,&local_3c8);
    if (local_5c0._8_8_ == local_3e8._M_string_length) {
      if ((rhash_context *)local_5c0._8_8_ == (rhash_context *)0x0) {
        bVar4 = true;
      }
      else {
        iVar6 = bcmp((void *)local_5c0._0_8_,local_3e8._M_dataplus._M_p,local_5c0._8_8_);
        bVar4 = iVar6 == 0;
      }
    }
    else {
      bVar4 = false;
    }
    if (bVar4 == false) {
      if ((cmCryptoHash *)local_5c0._0_8_ != (cmCryptoHash *)(local_5c0 + 0x10)) {
        operator_delete((void *)local_5c0._0_8_,local_5c0._16_8_ + 1);
      }
      if (local_590 != (undefined1  [8])local_580) {
        operator_delete((void *)local_590,
                        CONCAT71(local_580[0]._M_allocated_capacity._1_7_,
                                 local_580[0]._M_local_buf[0]) + 1);
      }
    }
    else {
      std::__cxx11::string::_M_replace((ulong)local_590,0,local_588,0x5720dc);
      std::__cxx11::string::_M_append(local_590,(ulong)local_328);
      std::__cxx11::string::append(local_590);
      if (local_388._M_string_length != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_308);
        poVar11 = (ostream *)std::ostream::operator<<(local_308,0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,";\"",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar11,(char *)local_590,(long)local_588);
        pcVar2 = (this->super_cmCommand).Makefile;
        std::__cxx11::stringbuf::str();
        cmMakefile::AddDefinition(pcVar2,&local_388,local_3a8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
          operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_308);
        std::ios_base::~ios_base(local_298);
      }
      if ((cmCryptoHash *)local_5c0._0_8_ != (cmCryptoHash *)(local_5c0 + 0x10)) {
        operator_delete((void *)local_5c0._0_8_,local_5c0._16_8_ + 1);
      }
      if (local_590 != (undefined1  [8])local_580) {
        operator_delete((void *)local_590,
                        CONCAT71(local_580[0]._M_allocated_capacity._1_7_,
                                 local_580[0]._M_local_buf[0]) + 1);
      }
      if (bVar4 != false) goto LAB_002f4bad;
    }
  }
  else {
    bVar4 = false;
  }
  cmsys::SystemTools::GetFilenamePath(&local_3a8,&local_3c8);
  bVar5 = cmsys::SystemTools::FileExists(local_3a8._M_dataplus._M_p);
  if ((bVar5) || (bVar5 = cmsys::SystemTools::MakeDirectory(local_3a8._M_dataplus._M_p), bVar5)) {
    std::ofstream::ofstream(local_308,local_3c8._M_dataplus._M_p,_S_bin);
    if ((abStack_2e8[*(long *)((long)local_308 + -0x18)] & 5) == 0) {
      curl_global_init(3);
      data = curl_easy_init();
      if (data == (CURL_conflict *)0x0) {
        local_590 = (undefined1  [8])local_580;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_590,"DOWNLOAD error initializing curl.","");
        cmCommand::SetError(&this->super_cmCommand,(string *)local_590);
        goto LAB_002f4354;
      }
      local_3f0.Easy = data;
      CVar7 = curl_easy_setopt(data,CURLOPT_URL,local_b0[0]);
      if (CVar7 == CURLE_OK) {
        CVar7 = curl_easy_setopt(data,CURLOPT_FAILONERROR,1);
        if (CVar7 != CURLE_OK) {
          local_590 = (undefined1  [8])local_580;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_590,"DOWNLOAD cannot set http failure option: ","");
          curl_easy_strerror(CVar7);
          std::__cxx11::string::append(local_590);
          cmCommand::SetError(&this->super_cmCommand,(string *)local_590);
          goto LAB_002f4a8c;
        }
        CVar7 = curl_easy_setopt(data,CURLOPT_USERAGENT,"curl/7.54.1");
        if (CVar7 != CURLE_OK) {
          local_590 = (undefined1  [8])local_580;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_590,"DOWNLOAD cannot set user agent option: ","");
          curl_easy_strerror(CVar7);
          std::__cxx11::string::append(local_590);
          cmCommand::SetError(&this->super_cmCommand,(string *)local_590);
          goto LAB_002f4a8c;
        }
        CVar7 = curl_easy_setopt(data,CURLOPT_WRITEFUNCTION,
                                 anon_unknown.dwarf_4fa30e::cmWriteToFileCallback);
        if (CVar7 != CURLE_OK) {
          local_590 = (undefined1  [8])local_580;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_590,"DOWNLOAD cannot set write function: ","");
          curl_easy_strerror(CVar7);
          std::__cxx11::string::append(local_590);
          cmCommand::SetError(&this->super_cmCommand,(string *)local_590);
          goto LAB_002f4a8c;
        }
        CVar7 = curl_easy_setopt(data,CURLOPT_DEBUGFUNCTION,
                                 anon_unknown.dwarf_4fa30e::cmFileCommandCurlDebugCallback);
        if (CVar7 != CURLE_OK) {
          local_590 = (undefined1  [8])local_580;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_590,"DOWNLOAD cannot set debug function: ","");
          curl_easy_strerror(CVar7);
          std::__cxx11::string::append(local_590);
          cmCommand::SetError(&this->super_cmCommand,(string *)local_590);
          goto LAB_002f4a8c;
        }
        if (local_5d1 == false) {
          CVar7 = curl_easy_setopt(data,CURLOPT_SSL_VERIFYPEER,0);
          if (CVar7 == CURLE_OK) goto LAB_002f4da9;
          local_590 = (undefined1  [8])local_580;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_590,"Unable to set TLS/SSL Verify off: ","");
          curl_easy_strerror(CVar7);
          std::__cxx11::string::append(local_590);
          cmCommand::SetError(&this->super_cmCommand,(string *)local_590);
          goto LAB_002f4a8c;
        }
        CVar7 = curl_easy_setopt(data,CURLOPT_SSL_VERIFYPEER,1);
        if (CVar7 != CURLE_OK) {
          local_590 = (undefined1  [8])local_580;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_590,"Unable to set TLS/SSL Verify on: ","");
          curl_easy_strerror(CVar7);
          std::__cxx11::string::append(local_590);
          cmCommand::SetError(&this->super_cmCommand,(string *)local_590);
          goto LAB_002f4a8c;
        }
LAB_002f4da9:
        cmCurlSetCAInfo_abi_cxx11_(&local_70,data,local_350);
        if (local_70._M_string_length == 0) {
          local_368.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start = (char *)0x0;
          local_368.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          local_368.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          CVar7 = curl_easy_setopt(data,CURLOPT_WRITEDATA,local_308);
          if (CVar7 == CURLE_OK) {
            CVar7 = curl_easy_setopt(data,CURLOPT_DEBUGDATA,&local_368);
            if (CVar7 != CURLE_OK) {
              local_590 = (undefined1  [8])local_580;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_590,"DOWNLOAD cannot set debug data: ","");
              curl_easy_strerror(CVar7);
              std::__cxx11::string::append(local_590);
              cmCommand::SetError(&this->super_cmCommand,(string *)local_590);
              goto LAB_002f4f27;
            }
            CVar7 = curl_easy_setopt(data,CURLOPT_FOLLOWLOCATION,1);
            if (CVar7 != CURLE_OK) {
              local_590 = (undefined1  [8])local_580;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_590,"DOWNLOAD cannot set follow-redirect option: ","");
              curl_easy_strerror(CVar7);
              std::__cxx11::string::append(local_590);
              cmCommand::SetError(&this->super_cmCommand,(string *)local_590);
              goto LAB_002f4f27;
            }
            if ((local_108._M_string_length != 0) &&
               (CVar7 = curl_easy_setopt(data,CURLOPT_VERBOSE,1), CVar7 != CURLE_OK)) {
              local_590 = (undefined1  [8])local_580;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_590,"DOWNLOAD cannot set verbose: ","");
              curl_easy_strerror(CVar7);
              std::__cxx11::string::append(local_590);
              cmCommand::SetError(&this->super_cmCommand,(string *)local_590);
              goto LAB_002f4f27;
            }
            if ((0 < lVar9) &&
               (CVar7 = curl_easy_setopt(data,CURLOPT_TIMEOUT,lVar9), CVar7 != CURLE_OK)) {
              local_590 = (undefined1  [8])local_580;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_590,"DOWNLOAD cannot set timeout: ","");
              curl_easy_strerror(CVar7);
              std::__cxx11::string::append(local_590);
              cmCommand::SetError(&this->super_cmCommand,(string *)local_590);
              goto LAB_002f4f27;
            }
            if (0 < local_5c8) {
              curl_easy_setopt(data,CURLOPT_LOW_SPEED_LIMIT,1);
              curl_easy_setopt(data,CURLOPT_LOW_SPEED_TIME,local_5c8);
            }
            anon_unknown.dwarf_4fa30e::cURLProgressHelper::cURLProgressHelper
                      ((cURLProgressHelper *)local_5c0,this,"download");
            if ((local_418 & 1) == 0) {
LAB_002f51d4:
              if ((local_c8 != 0) &&
                 (CVar7 = curl_easy_setopt(data,CURLOPT_USERPWD,local_d0), CVar7 != CURLE_OK)) {
                local_590 = (undefined1  [8])local_580;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_590,"DOWNLOAD cannot set user password: ","");
                curl_easy_strerror(CVar7);
                std::__cxx11::string::append(local_590);
                cmCommand::SetError(&this->super_cmCommand,(string *)local_590);
                goto LAB_002f5248;
              }
              if (local_e8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start ==
                  local_e8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                list = (curl_slist *)0x0;
              }
              else {
                list = (curl_slist *)0x0;
                pbVar16 = local_e8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                do {
                  list = curl_slist_append(list,(pbVar16->_M_dataplus)._M_p);
                  pbVar16 = pbVar16 + 1;
                } while (pbVar16 !=
                         local_e8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
              }
              curl_easy_setopt(data,CURLOPT_HTTPHEADER,list);
              CVar7 = curl_easy_perform(data);
              curl_slist_free_all(list);
              local_3f0.Easy = (CURL_conflict *)0x0;
              curl_easy_cleanup(data);
              if (local_388._M_string_length != 0) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_590);
                poVar11 = (ostream *)std::ostream::operator<<(local_590,CVar7);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11,";\"",2);
                pcVar12 = curl_easy_strerror(CVar7);
                poVar11 = std::operator<<(poVar11,pcVar12);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\"",1);
                pcVar2 = (this->super_cmCommand).Makefile;
                std::__cxx11::stringbuf::str();
                cmMakefile::AddDefinition(pcVar2,&local_388,local_410._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_410._M_dataplus._M_p != &local_410.field_2) {
                  operator_delete(local_410._M_dataplus._M_p,
                                  local_410.field_2._M_allocated_capacity + 1);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_590);
                std::ios_base::~ios_base(local_520);
              }
              curl_global_cleanup();
              std::ostream::flush();
              std::ofstream::close();
              if (local_5d0.x_ == (cmCryptoHash *)0x0) {
LAB_002f57e0:
                bVar4 = true;
                if (local_108._M_string_length != 0) {
                  local_590 = (undefined1  [8])((ulong)local_590 & 0xffffffffffffff00);
                  std::vector<char,_std::allocator<char>_>::push_back(&local_368,local_590);
                  cmMakefile::AddDefinition
                            ((this->super_cmCommand).Makefile,&local_108,
                             local_368.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_start);
                }
              }
              else {
                cmCryptoHash::HashFile(&local_410,local_5d0.x_,&local_3c8);
                if ((rhash_context *)local_410._M_string_length == (rhash_context *)0x0) {
                  local_590 = (undefined1  [8])local_580;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_590,"DOWNLOAD cannot compute hash on downloaded file",
                             "");
                  cmCommand::SetError(&this->super_cmCommand,(string *)local_590);
                  if (local_590 != (undefined1  [8])local_580) {
                    operator_delete((void *)local_590,
                                    CONCAT71(local_580[0]._M_allocated_capacity._1_7_,
                                             local_580[0]._M_local_buf[0]) + 1);
                  }
LAB_002f57b1:
                  bVar5 = false;
                  bVar4 = false;
                }
                else if ((local_3e8._M_string_length != local_410._M_string_length) ||
                        ((bVar5 = true,
                         (rhash_context *)local_3e8._M_string_length != (rhash_context *)0x0 &&
                         (iVar6 = bcmp(local_3e8._M_dataplus._M_p,local_410._M_dataplus._M_p,
                                       local_3e8._M_string_length), iVar6 != 0)))) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_590);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_590,"DOWNLOAD HASH mismatch",0x16);
                  poVar11 = std::endl<char,std::char_traits<char>>((ostream *)local_590);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"  for file: [",0xd);
                  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar11,local_3c8._M_dataplus._M_p,local_3c8._M_string_length
                                      );
                  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"]",1);
                  poVar11 = std::endl<char,std::char_traits<char>>(poVar11);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar11,"    expected hash: [",0x14);
                  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar11,local_3e8._M_dataplus._M_p,local_3e8._M_string_length
                                      );
                  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"]",1);
                  poVar11 = std::endl<char,std::char_traits<char>>(poVar11);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar11,"      actual hash: [",0x14);
                  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar11,local_410._M_dataplus._M_p,local_410._M_string_length
                                      );
                  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"]",1);
                  poVar11 = std::endl<char,std::char_traits<char>>(poVar11);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar11,"           status: [",0x14);
                  poVar11 = (ostream *)std::ostream::operator<<(poVar11,CVar7);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar11,";\"",2);
                  pcVar12 = curl_easy_strerror(CVar7);
                  poVar11 = std::operator<<(poVar11,pcVar12);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\"]",2);
                  std::endl<char,std::char_traits<char>>(poVar11);
                  if (CVar7 == CURLE_OK && local_388._M_string_length != 0) {
                    std::operator+(&local_50,"1;HASH mismatch: expected: ",&local_3e8);
                    plVar13 = (long *)std::__cxx11::string::append((char *)&local_50);
                    psVar15 = (size_type *)(plVar13 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar13 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar15) {
                      local_90.field_2._M_allocated_capacity = *psVar15;
                      local_90.field_2._8_8_ = plVar13[3];
                      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
                    }
                    else {
                      local_90.field_2._M_allocated_capacity = *psVar15;
                      local_90._M_dataplus._M_p = (pointer)*plVar13;
                    }
                    local_90._M_string_length = plVar13[1];
                    *plVar13 = (long)psVar15;
                    plVar13[1] = 0;
                    *(undefined1 *)(plVar13 + 2) = 0;
                    std::operator+(&local_348,&local_90,&local_410);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_90._M_dataplus._M_p != &local_90.field_2) {
                      operator_delete(local_90._M_dataplus._M_p,
                                      local_90.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_50._M_dataplus._M_p != &local_50.field_2) {
                      operator_delete(local_50._M_dataplus._M_p,
                                      local_50.field_2._M_allocated_capacity + 1);
                    }
                    cmMakefile::AddDefinition
                              ((this->super_cmCommand).Makefile,&local_388,
                               local_348._M_dataplus._M_p);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_348._M_dataplus._M_p != &local_348.field_2) {
                      operator_delete(local_348._M_dataplus._M_p,
                                      local_348.field_2._M_allocated_capacity + 1);
                    }
                  }
                  std::__cxx11::stringbuf::str();
                  cmCommand::SetError(&this->super_cmCommand,&local_348);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_348._M_dataplus._M_p != &local_348.field_2) {
                    operator_delete(local_348._M_dataplus._M_p,
                                    local_348.field_2._M_allocated_capacity + 1);
                  }
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_590);
                  std::ios_base::~ios_base(local_520);
                  goto LAB_002f57b1;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_410._M_dataplus._M_p != &local_410.field_2) {
                  operator_delete(local_410._M_dataplus._M_p,
                                  local_410.field_2._M_allocated_capacity + 1);
                }
                if (bVar5) goto LAB_002f57e0;
              }
            }
            else {
              CVar7 = curl_easy_setopt(data,CURLOPT_NOPROGRESS,0);
              if (CVar7 == CURLE_OK) {
                CVar7 = curl_easy_setopt(data,CURLOPT_PROGRESSFUNCTION,
                                         anon_unknown.dwarf_4fa30e::cmFileDownloadProgressCallback);
                if (CVar7 == CURLE_OK) {
                  CVar7 = curl_easy_setopt(data,CURLOPT_PROGRESSDATA,local_5c0);
                  if (CVar7 == CURLE_OK) goto LAB_002f51d4;
                  local_590 = (undefined1  [8])local_580;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_590,"DOWNLOAD cannot set progress data: ","");
                  curl_easy_strerror(CVar7);
                  std::__cxx11::string::append(local_590);
                  cmCommand::SetError(&this->super_cmCommand,(string *)local_590);
                }
                else {
                  local_590 = (undefined1  [8])local_580;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_590,"DOWNLOAD cannot set progress function: ","");
                  curl_easy_strerror(CVar7);
                  std::__cxx11::string::append(local_590);
                  cmCommand::SetError(&this->super_cmCommand,(string *)local_590);
                }
              }
              else {
                local_590 = (undefined1  [8])local_580;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_590,"DOWNLOAD cannot set noprogress value: ","");
                curl_easy_strerror(CVar7);
                std::__cxx11::string::append(local_590);
                cmCommand::SetError(&this->super_cmCommand,(string *)local_590);
              }
LAB_002f5248:
              if (local_590 != (undefined1  [8])local_580) {
                operator_delete((void *)local_590,
                                CONCAT71(local_580[0]._M_allocated_capacity._1_7_,
                                         local_580[0]._M_local_buf[0]) + 1);
              }
              bVar4 = false;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_5c0._16_8_ != &local_5a0) {
              operator_delete((void *)local_5c0._16_8_,local_5a0._M_allocated_capacity + 1);
            }
          }
          else {
            local_590 = (undefined1  [8])local_580;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_590,"DOWNLOAD cannot set write data: ","");
            curl_easy_strerror(CVar7);
            std::__cxx11::string::append(local_590);
            cmCommand::SetError(&this->super_cmCommand,(string *)local_590);
LAB_002f4f27:
            if (local_590 != (undefined1  [8])local_580) {
              operator_delete((void *)local_590,
                              CONCAT71(local_580[0]._M_allocated_capacity._1_7_,
                                       local_580[0]._M_local_buf[0]) + 1);
            }
            bVar4 = false;
          }
          if (local_368.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start != (char *)0x0) {
            operator_delete(local_368.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_368.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_368.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
        }
        else {
          cmCommand::SetError(&this->super_cmCommand,&local_70);
          bVar4 = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        local_590 = (undefined1  [8])local_580;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_590,"DOWNLOAD cannot set url: ","");
        curl_easy_strerror(CVar7);
        std::__cxx11::string::append(local_590);
        cmCommand::SetError(&this->super_cmCommand,(string *)local_590);
LAB_002f4a8c:
        if (local_590 != (undefined1  [8])local_580) {
          operator_delete((void *)local_590,
                          CONCAT71(local_580[0]._M_allocated_capacity._1_7_,
                                   local_580[0]._M_local_buf[0]) + 1);
        }
        bVar4 = false;
      }
      anon_unknown.dwarf_4fa30e::cURLEasyGuard::~cURLEasyGuard(&local_3f0);
    }
    else {
      local_590 = (undefined1  [8])local_580;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_590,"DOWNLOAD cannot open file for write.","");
      cmCommand::SetError(&this->super_cmCommand,(string *)local_590);
LAB_002f4354:
      if (local_590 != (undefined1  [8])local_580) {
        operator_delete((void *)local_590,
                        CONCAT71(local_580[0]._M_allocated_capacity._1_7_,
                                 local_580[0]._M_local_buf[0]) + 1);
      }
      bVar4 = false;
    }
    local_308 = (undefined1  [8])_VTT;
    *(undefined8 *)(local_308 + *(long *)(_VTT->_M_local_buf + -0x18)) = _vtable;
    std::filebuf::~filebuf((filebuf *)&local_300);
    std::ios_base::~ios_base(local_210);
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_590,
                   "DOWNLOAD error: cannot create directory \'",&local_3a8);
    plVar13 = (long *)std::__cxx11::string::append(local_590);
    local_308 = (undefined1  [8])&local_2f8;
    paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar13 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar13 == paVar14) {
      local_2f8._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_2f8._8_8_ = plVar13[3];
    }
    else {
      local_2f8._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_308 = (undefined1  [8])*plVar13;
    }
    local_300 = plVar13[1];
    *plVar13 = (long)paVar14;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    if (local_590 != (undefined1  [8])local_580) {
      operator_delete((void *)local_590,
                      CONCAT71(local_580[0]._M_allocated_capacity._1_7_,local_580[0]._M_local_buf[0]
                              ) + 1);
    }
    cmCommand::SetError(&this->super_cmCommand,(string *)local_308);
    if (local_308 != (undefined1  [8])&local_2f8) {
      operator_delete((void *)local_308,local_2f8._M_allocated_capacity + 1);
    }
    bVar4 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
    operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
  }
LAB_002f4bad:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e8);
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,CONCAT71(uStack_bf,local_c0) + 1);
  }
  ::cm::auto_ptr<cmCryptoHash>::~auto_ptr(&local_5d0);
  if (local_328 != &local_318) {
    operator_delete(local_328,CONCAT71(uStack_317,local_318) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
    operator_delete(local_3e8._M_dataplus._M_p,
                    CONCAT71(local_3e8.field_2._M_allocated_capacity._1_7_,
                             local_3e8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p,
                    CONCAT71(local_388.field_2._M_allocated_capacity._1_7_,
                             local_388.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,
                    CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                             local_108.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
    operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
  }
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0],local_a0[0] + 1);
  }
  return bVar4;
}

Assistant:

bool cmFileCommand::HandleDownloadCommand(std::vector<std::string> const& args)
{
#if defined(CMAKE_BUILD_WITH_CMAKE)
  std::vector<std::string>::const_iterator i = args.begin();
  if (args.size() < 3) {
    this->SetError("DOWNLOAD must be called with at least three arguments.");
    return false;
  }
  ++i; // Get rid of subcommand
  std::string url = *i;
  ++i;
  std::string file = *i;
  ++i;

  long timeout = 0;
  long inactivity_timeout = 0;
  std::string logVar;
  std::string statusVar;
  bool tls_verify = this->Makefile->IsOn("CMAKE_TLS_VERIFY");
  const char* cainfo = this->Makefile->GetDefinition("CMAKE_TLS_CAINFO");
  std::string expectedHash;
  std::string hashMatchMSG;
  CM_AUTO_PTR<cmCryptoHash> hash;
  bool showProgress = false;
  std::string userpwd;

  std::vector<std::string> curl_headers;

  while (i != args.end()) {
    if (*i == "TIMEOUT") {
      ++i;
      if (i != args.end()) {
        timeout = atol(i->c_str());
      } else {
        this->SetError("DOWNLOAD missing time for TIMEOUT.");
        return false;
      }
    } else if (*i == "INACTIVITY_TIMEOUT") {
      ++i;
      if (i != args.end()) {
        inactivity_timeout = atol(i->c_str());
      } else {
        this->SetError("DOWNLOAD missing time for INACTIVITY_TIMEOUT.");
        return false;
      }
    } else if (*i == "LOG") {
      ++i;
      if (i == args.end()) {
        this->SetError("DOWNLOAD missing VAR for LOG.");
        return false;
      }
      logVar = *i;
    } else if (*i == "STATUS") {
      ++i;
      if (i == args.end()) {
        this->SetError("DOWNLOAD missing VAR for STATUS.");
        return false;
      }
      statusVar = *i;
    } else if (*i == "TLS_VERIFY") {
      ++i;
      if (i != args.end()) {
        tls_verify = cmSystemTools::IsOn(i->c_str());
      } else {
        this->SetError("TLS_VERIFY missing bool value.");
        return false;
      }
    } else if (*i == "TLS_CAINFO") {
      ++i;
      if (i != args.end()) {
        cainfo = i->c_str();
      } else {
        this->SetError("TLS_CAFILE missing file value.");
        return false;
      }
    } else if (*i == "EXPECTED_MD5") {
      ++i;
      if (i == args.end()) {
        this->SetError("DOWNLOAD missing sum value for EXPECTED_MD5.");
        return false;
      }
      hash =
        CM_AUTO_PTR<cmCryptoHash>(new cmCryptoHash(cmCryptoHash::AlgoMD5));
      hashMatchMSG = "MD5 sum";
      expectedHash = cmSystemTools::LowerCase(*i);
    } else if (*i == "SHOW_PROGRESS") {
      showProgress = true;
    } else if (*i == "EXPECTED_HASH") {
      ++i;
      if (i == args.end()) {
        this->SetError("DOWNLOAD missing ALGO=value for EXPECTED_HASH.");
        return false;
      }
      std::string::size_type pos = i->find("=");
      if (pos == std::string::npos) {
        std::string err =
          "DOWNLOAD EXPECTED_HASH expects ALGO=value but got: ";
        err += *i;
        this->SetError(err);
        return false;
      }
      std::string algo = i->substr(0, pos);
      expectedHash = cmSystemTools::LowerCase(i->substr(pos + 1));
      hash = CM_AUTO_PTR<cmCryptoHash>(cmCryptoHash::New(algo.c_str()));
      if (!hash.get()) {
        std::string err = "DOWNLOAD EXPECTED_HASH given unknown ALGO: ";
        err += algo;
        this->SetError(err);
        return false;
      }
      hashMatchMSG = algo + " hash";
    } else if (*i == "USERPWD") {
      ++i;
      if (i == args.end()) {
        this->SetError("DOWNLOAD missing string for USERPWD.");
        return false;
      }
      userpwd = *i;
    } else if (*i == "HTTPHEADER") {
      ++i;
      if (i == args.end()) {
        this->SetError("DOWNLOAD missing string for HTTPHEADER.");
        return false;
      }
      curl_headers.push_back(*i);
    } else {
      // Do not return error for compatibility reason.
      std::string err = "Unexpected argument: ";
      err += *i;
      this->Makefile->IssueMessage(cmake::AUTHOR_WARNING, err);
    }
    ++i;
  }
  // If file exists already, and caller specified an expected md5 or sha,
  // and the existing file already has the expected hash, then simply
  // return.
  //
  if (cmSystemTools::FileExists(file.c_str()) && hash.get()) {
    std::string msg;
    std::string actualHash = hash->HashFile(file);
    if (actualHash == expectedHash) {
      msg = "returning early; file already exists with expected ";
      msg += hashMatchMSG;
      msg += "\"";
      if (!statusVar.empty()) {
        std::ostringstream result;
        result << (int)0 << ";\"" << msg;
        this->Makefile->AddDefinition(statusVar, result.str().c_str());
      }
      return true;
    }
  }
  // Make sure parent directory exists so we can write to the file
  // as we receive downloaded bits from curl...
  //
  std::string dir = cmSystemTools::GetFilenamePath(file);
  if (!cmSystemTools::FileExists(dir.c_str()) &&
      !cmSystemTools::MakeDirectory(dir.c_str())) {
    std::string errstring = "DOWNLOAD error: cannot create directory '" + dir +
      "' - Specify file by full path name and verify that you "
      "have directory creation and file write privileges.";
    this->SetError(errstring);
    return false;
  }

  cmsys::ofstream fout(file.c_str(), std::ios::binary);
  if (!fout) {
    this->SetError("DOWNLOAD cannot open file for write.");
    return false;
  }

#if defined(_WIN32)
  url = fix_file_url_windows(url);
#endif

  ::CURL* curl;
  ::curl_global_init(CURL_GLOBAL_DEFAULT);
  curl = ::curl_easy_init();
  if (!curl) {
    this->SetError("DOWNLOAD error initializing curl.");
    return false;
  }

  cURLEasyGuard g_curl(curl);
  ::CURLcode res = ::curl_easy_setopt(curl, CURLOPT_URL, url.c_str());
  check_curl_result(res, "DOWNLOAD cannot set url: ");

  // enable HTTP ERROR parsing
  res = ::curl_easy_setopt(curl, CURLOPT_FAILONERROR, 1);
  check_curl_result(res, "DOWNLOAD cannot set http failure option: ");

  res = ::curl_easy_setopt(curl, CURLOPT_USERAGENT, "curl/" LIBCURL_VERSION);
  check_curl_result(res, "DOWNLOAD cannot set user agent option: ");

  res = ::curl_easy_setopt(curl, CURLOPT_WRITEFUNCTION, cmWriteToFileCallback);
  check_curl_result(res, "DOWNLOAD cannot set write function: ");

  res = ::curl_easy_setopt(curl, CURLOPT_DEBUGFUNCTION,
                           cmFileCommandCurlDebugCallback);
  check_curl_result(res, "DOWNLOAD cannot set debug function: ");

  // check to see if TLS verification is requested
  if (tls_verify) {
    res = ::curl_easy_setopt(curl, CURLOPT_SSL_VERIFYPEER, 1);
    check_curl_result(res, "Unable to set TLS/SSL Verify on: ");
  } else {
    res = ::curl_easy_setopt(curl, CURLOPT_SSL_VERIFYPEER, 0);
    check_curl_result(res, "Unable to set TLS/SSL Verify off: ");
  }
  // check to see if a CAINFO file has been specified
  // command arg comes first
  std::string const& cainfo_err = cmCurlSetCAInfo(curl, cainfo);
  if (!cainfo_err.empty()) {
    this->SetError(cainfo_err);
    return false;
  }

  cmFileCommandVectorOfChar chunkDebug;

  res = ::curl_easy_setopt(curl, CURLOPT_WRITEDATA, (void*)&fout);
  check_curl_result(res, "DOWNLOAD cannot set write data: ");

  res = ::curl_easy_setopt(curl, CURLOPT_DEBUGDATA, (void*)&chunkDebug);
  check_curl_result(res, "DOWNLOAD cannot set debug data: ");

  res = ::curl_easy_setopt(curl, CURLOPT_FOLLOWLOCATION, 1L);
  check_curl_result(res, "DOWNLOAD cannot set follow-redirect option: ");

  if (!logVar.empty()) {
    res = ::curl_easy_setopt(curl, CURLOPT_VERBOSE, 1);
    check_curl_result(res, "DOWNLOAD cannot set verbose: ");
  }

  if (timeout > 0) {
    res = ::curl_easy_setopt(curl, CURLOPT_TIMEOUT, timeout);
    check_curl_result(res, "DOWNLOAD cannot set timeout: ");
  }

  if (inactivity_timeout > 0) {
    // Give up if there is no progress for a long time.
    ::curl_easy_setopt(curl, CURLOPT_LOW_SPEED_LIMIT, 1);
    ::curl_easy_setopt(curl, CURLOPT_LOW_SPEED_TIME, inactivity_timeout);
  }

  // Need the progress helper's scope to last through the duration of
  // the curl_easy_perform call... so this object is declared at function
  // scope intentionally, rather than inside the "if(showProgress)"
  // block...
  //
  cURLProgressHelper helper(this, "download");

  if (showProgress) {
    res = ::curl_easy_setopt(curl, CURLOPT_NOPROGRESS, 0);
    check_curl_result(res, "DOWNLOAD cannot set noprogress value: ");

    res = ::curl_easy_setopt(curl, CURLOPT_PROGRESSFUNCTION,
                             cmFileDownloadProgressCallback);
    check_curl_result(res, "DOWNLOAD cannot set progress function: ");

    res = ::curl_easy_setopt(curl, CURLOPT_PROGRESSDATA,
                             reinterpret_cast<void*>(&helper));
    check_curl_result(res, "DOWNLOAD cannot set progress data: ");
  }

  if (!userpwd.empty()) {
    res = ::curl_easy_setopt(curl, CURLOPT_USERPWD, userpwd.c_str());
    check_curl_result(res, "DOWNLOAD cannot set user password: ");
  }

  struct curl_slist* headers = CM_NULLPTR;
  for (std::vector<std::string>::const_iterator h = curl_headers.begin();
       h != curl_headers.end(); ++h) {
    headers = ::curl_slist_append(headers, h->c_str());
  }
  ::curl_easy_setopt(curl, CURLOPT_HTTPHEADER, headers);

  res = ::curl_easy_perform(curl);

  ::curl_slist_free_all(headers);

  /* always cleanup */
  g_curl.release();
  ::curl_easy_cleanup(curl);

  if (!statusVar.empty()) {
    std::ostringstream result;
    result << (int)res << ";\"" << ::curl_easy_strerror(res) << "\"";
    this->Makefile->AddDefinition(statusVar, result.str().c_str());
  }

  ::curl_global_cleanup();

  // Explicitly flush/close so we can measure the md5 accurately.
  //
  fout.flush();
  fout.close();

  // Verify MD5 sum if requested:
  //
  if (hash.get()) {
    std::string actualHash = hash->HashFile(file);
    if (actualHash.empty()) {
      this->SetError("DOWNLOAD cannot compute hash on downloaded file");
      return false;
    }

    if (expectedHash != actualHash) {
      std::ostringstream oss;
      oss << "DOWNLOAD HASH mismatch" << std::endl
          << "  for file: [" << file << "]" << std::endl
          << "    expected hash: [" << expectedHash << "]" << std::endl
          << "      actual hash: [" << actualHash << "]" << std::endl
          << "           status: [" << (int)res << ";\""
          << ::curl_easy_strerror(res) << "\"]" << std::endl;

      if (!statusVar.empty() && res == 0) {
        std::string status = "1;HASH mismatch: "
                             "expected: " +
          expectedHash + " actual: " + actualHash;
        this->Makefile->AddDefinition(statusVar, status.c_str());
      }

      this->SetError(oss.str());
      return false;
    }
  }

  if (!logVar.empty()) {
    chunkDebug.push_back(0);
    this->Makefile->AddDefinition(logVar, &*chunkDebug.begin());
  }

  return true;
#else
  this->SetError("DOWNLOAD not supported by bootstrap cmake.");
  return false;
#endif
}